

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O0

void wasm::debuginfo::copyBetweenFunctions
               (Expression *origin,Expression *copy,Function *originFunc,Function *copyFunc)

{
  undefined8 uVar1;
  bool bVar2;
  unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
  *this;
  size_type sVar3;
  size_type sVar4;
  ulong uVar5;
  reference ppEVar6;
  pointer ppVar7;
  mapped_type *pmVar8;
  optional<wasm::Function::DebugLocation> location;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
  local_238;
  iterator iter;
  Index i;
  unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
  *copyDebug;
  unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
  *originDebug;
  Lister copyList;
  undefined1 local_118 [8];
  Lister originList;
  Function *copyFunc_local;
  Function *originFunc_local;
  Expression *copy_local;
  Expression *origin_local;
  
  originList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)copyFunc;
  originFunc_local = (Function *)copy;
  copy_local = origin;
  bVar2 = std::
          unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
          ::empty(&originFunc->debugLocations);
  if (!bVar2) {
    copyBetweenFunctions::Lister::Lister((Lister *)local_118);
    Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::walk
              ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)local_118,
               &copy_local);
    copyBetweenFunctions::Lister::Lister((Lister *)&originDebug);
    Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::walk
              ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)&originDebug,
               (Expression **)&originFunc_local);
    this = (unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
            *)(originList.list.
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x1b);
    sVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                       &originList.
                        super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                        super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                        currModule);
    sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                       &copyList.
                        super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                        super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                        currModule);
    if (sVar3 != sVar4) {
      __assert_fail("originList.list.size() == copyList.list.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/debuginfo.cpp"
                    ,0x2c,
                    "void wasm::debuginfo::copyBetweenFunctions(Expression *, Expression *, Function *, Function *)"
                   );
    }
    for (iter.
         super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
         ._M_cur._4_4_ = 0;
        uVar5 = (ulong)iter.
                       super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                       ._M_cur._4_4_,
        sVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &originList.
                            super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                            super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                            currModule), uVar5 < sVar3;
        iter.
        super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
        ._M_cur._4_4_ =
             iter.
             super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
             ._M_cur._4_4_ + 1) {
      ppEVar6 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &originList.
                            super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                            super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                            currModule,
                           (ulong)iter.
                                  super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                                  ._M_cur._4_4_);
      local_238._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
           ::find(&originFunc->debugLocations,ppEVar6);
      location.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Function::DebugLocation>._16_8_ =
           std::
           unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
           ::end(&originFunc->debugLocations);
      bVar2 = std::__detail::operator!=
                        (&local_238,
                         (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                          *)((long)&location.
                                    super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
                                    _M_payload.
                                    super__Optional_payload_base<wasm::Function::DebugLocation>.
                                    _M_payload._M_value.symbolNameIndex.
                                    super__Optional_base<unsigned_int,_true,_true> + 4));
      if (bVar2) {
        ppVar7 = std::__detail::
                 _Node_iterator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false,_false>
                               *)&local_238);
        location.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._8_8_ =
             *(undefined8 *)
              ((long)&(ppVar7->second).
                      super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                      _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> + 4);
        uVar1 = *(undefined8 *)
                 &(ppVar7->second).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
                  _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload;
        location.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._0_8_ =
             *(undefined8 *)
              ((long)&(ppVar7->second).
                      super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8);
        ppEVar6 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &copyList.
                              super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                              .super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                              currModule,
                             (ulong)iter.
                                    super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                                    ._M_cur._4_4_);
        pmVar8 = std::
                 unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
                 ::operator[](this,ppEVar6);
        *(undefined8 *)
         &(pmVar8->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload = uVar1;
        *(undefined8 *)
         ((long)&(pmVar8->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload +
         8) = location.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._0_8_;
        *(undefined8 *)
         ((long)&(pmVar8->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                 _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload
         + 4) = location.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._8_8_;
      }
    }
    copyBetweenFunctions::Lister::~Lister((Lister *)&originDebug);
    copyBetweenFunctions::Lister::~Lister((Lister *)local_118);
  }
  return;
}

Assistant:

void copyBetweenFunctions(Expression* origin,
                          Expression* copy,
                          Function* originFunc,
                          Function* copyFunc) {
  if (originFunc->debugLocations.empty()) {
    return; // No debug info to copy
  }

  struct Lister : public PostWalker<Lister, UnifiedExpressionVisitor<Lister>> {
    std::vector<Expression*> list;
    void visitExpression(Expression* curr) { list.push_back(curr); }
  };

  Lister originList;
  originList.walk(origin);
  Lister copyList;
  copyList.walk(copy);

  auto& originDebug = originFunc->debugLocations;
  auto& copyDebug = copyFunc->debugLocations;

  assert(originList.list.size() == copyList.list.size());
  for (Index i = 0; i < originList.list.size(); i++) {
    auto iter = originDebug.find(originList.list[i]);
    if (iter != originDebug.end()) {
      auto location = iter->second;
      copyDebug[copyList.list[i]] = location;
    }
  }
}